

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall Imf_3_4::Array2D<float>::resizeErase(Array2D<float> *this,long sizeX,long sizeY)

{
  void *pvVar1;
  
  pvVar1 = operator_new__(-(ulong)((ulong)(sizeY * sizeX) >> 0x3e != 0) | sizeY * sizeX * 4);
  if (*(void **)(this + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(this + 0x10));
  }
  *(long *)this = sizeX;
  *(long *)(this + 8) = sizeY;
  *(void **)(this + 0x10) = pvVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}